

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  uint uVar6;
  uint _w;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int *piVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  void *pvVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  void *pvVar38;
  void *pvVar39;
  void *pvVar40;
  _func_int ***ppp_Var41;
  int iVar42;
  long lVar43;
  void *pvVar44;
  Allocator *pAVar45;
  void *pvVar46;
  void *pvVar47;
  long lVar48;
  void *pvVar49;
  void *pvVar50;
  void *pvVar51;
  ulong uVar52;
  ulong uVar53;
  void *pvVar54;
  void *pvVar55;
  ulong uVar56;
  void *pvVar57;
  void *pvVar58;
  ulong uVar59;
  void *pvVar60;
  void *pvVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  void *pvVar65;
  int iVar66;
  ulong uVar67;
  void *pvVar68;
  long lVar69;
  void *pvVar70;
  void *pvVar71;
  void *pvVar72;
  void *pvVar73;
  void *pvVar74;
  void *pvVar75;
  float fVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar83 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [16];
  float fVar121;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar126 [64];
  float fVar131;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 in_ZMM5 [64];
  undefined1 auVar135 [64];
  undefined1 auVar142 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 in_ZMM9 [64];
  float fVar148;
  undefined1 auVar147 [32];
  undefined1 in_ZMM10 [64];
  float *bias_c_G;
  float *gates_data_F;
  float *gates_data_I;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  float *gates_data_G;
  float *gates_data_O;
  Mat gates;
  void *local_300;
  void *local_2f8;
  void *local_2f0;
  void *local_2e0;
  void *local_2c8;
  void *local_278;
  void *local_218;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  Mat local_78;
  long lVar26;
  undefined1 auVar108 [32];
  undefined1 auVar114 [32];
  undefined1 auVar117 [32];
  undefined1 auVar125 [32];
  
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  _w = top_blob->w;
  uVar52 = (ulong)_w;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,_w,4,4,opt->workspace_allocator);
  iVar34 = -100;
  if (((Allocator *)local_78.data != (Allocator *)0x0) && ((long)local_78.c * local_78.cstep != 0))
  {
    if (0 < (int)uVar6) {
      uVar53 = (ulong)(int)_w;
      uVar56 = uVar53 & 0xfffffffffffffffe;
      uVar59 = (ulong)(_w * 2);
      uVar63 = (ulong)(_w * 3);
      iVar66 = (int)uVar5 >> 3;
      iVar42 = (int)_w >> 3;
      iVar34 = (uVar5 & 7) + 1;
      iVar35 = (_w & 7) + 1;
      lVar1 = (long)(int)(_w * 3) + uVar56;
      lVar25 = (long)(int)(_w * 2) + uVar56;
      uVar36 = 0;
      do {
        uVar23 = ~uVar36 + uVar6;
        if (reverse == 0) {
          uVar23 = uVar36;
        }
        lVar26 = (long)(int)uVar23;
        if (1 < (int)_w) {
          pvVar70 = (void *)(bottom_blob->w * lVar26 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar71 = bias_c->data;
          lVar27 = (long)bias_c->w * bias_c->elemsize;
          lVar28 = (long)local_78.w * local_78.elemsize;
          pvVar55 = weight_xc->data;
          lVar69 = (long)weight_xc->w * weight_xc->elemsize;
          lVar43 = (long)weight_hc->w * weight_hc->elemsize;
          local_2c8 = (void *)(lVar69 * uVar52 + (long)pvVar55);
          pvVar75 = (void *)(lVar69 * uVar59 + (long)pvVar55);
          pvVar72 = (void *)(lVar69 * uVar63 + (long)pvVar55);
          pvVar46 = (void *)(lVar69 * (uVar52 + 1) + (long)pvVar55);
          pvVar57 = (void *)(lVar69 * (uVar59 + 1) + (long)pvVar55);
          local_158 = (void *)(lVar69 * (uVar63 + 1) + (long)pvVar55);
          pvVar44 = weight_hc->data;
          pvVar60 = (void *)(lVar43 * uVar52 + (long)pvVar44);
          pvVar31 = (void *)(lVar43 * uVar59 + (long)pvVar44);
          local_160 = (void *)(lVar43 * uVar63 + (long)pvVar44);
          local_300 = (void *)(lVar43 * (uVar52 + 1) + (long)pvVar44);
          pvVar47 = (void *)(lVar43 * (uVar59 + 1) + (long)pvVar44);
          pvVar74 = (void *)(lVar43 * (uVar63 + 1) + (long)pvVar44);
          pvVar50 = hidden_state->data;
          lVar29 = lVar69 * 2;
          pvVar61 = (void *)((long)pvVar55 + lVar69);
          lVar30 = lVar43 * 2;
          pvVar68 = (void *)((long)pvVar44 + lVar43);
          uVar62 = 0;
          pvVar39 = pvVar44;
          local_168 = pvVar55;
          do {
            uVar67 = uVar62 | 1;
            lVar64 = uVar52 + uVar62 + 1;
            lVar32 = uVar59 + uVar62 + 1;
            lVar48 = uVar62 + uVar63 + 1;
            if (iVar66 < 1) {
              local_170 = (void *)(lVar69 * uVar62 + (long)pvVar55);
              local_178 = (void *)(lVar69 * (uVar62 + uVar52) + (long)pvVar55);
              local_180 = (void *)(lVar69 * (uVar62 + uVar59) + (long)pvVar55);
              pvVar40 = (void *)(lVar69 * (uVar62 + uVar63) + (long)pvVar55);
              local_188 = (void *)(lVar69 * uVar67 + (long)pvVar55);
              pvVar33 = (void *)(lVar69 * lVar64 + (long)pvVar55);
              pvVar73 = (void *)(lVar69 * lVar32 + (long)pvVar55);
              pvVar38 = (void *)(lVar69 * lVar48 + (long)pvVar55);
              auVar83 = ZEXT864(0);
              auVar98 = ZEXT864(0);
              auVar120 = ZEXT864(0);
              auVar126 = ZEXT864(0);
              auVar135 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar145 = ZEXT864(0);
              auVar109 = ZEXT864(0);
              pvVar65 = pvVar70;
            }
            else {
              auVar109 = ZEXT864(0);
              lVar37 = 0;
              auVar145 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar135 = ZEXT864(0);
              auVar126 = ZEXT864(0);
              auVar120 = ZEXT864(0);
              auVar98 = ZEXT864(0);
              auVar83 = ZEXT864(0);
              iVar24 = iVar66 + 1;
              do {
                pfVar2 = (float *)((long)pvVar70 + lVar37);
                fVar121 = *pfVar2;
                fVar131 = pfVar2[1];
                fVar127 = pfVar2[2];
                fVar136 = pfVar2[3];
                fVar128 = pfVar2[4];
                fVar137 = pfVar2[5];
                fVar129 = pfVar2[6];
                pfVar3 = (float *)((long)local_168 + lVar37);
                fVar130 = in_ZMM9._28_4_;
                auVar83 = ZEXT3264(CONCAT428(fVar130 + auVar83._28_4_,
                                             CONCAT424(fVar129 * pfVar3[6] + auVar83._24_4_,
                                                       CONCAT420(fVar137 * pfVar3[5] +
                                                                 auVar83._20_4_,
                                                                 CONCAT416(fVar128 * pfVar3[4] +
                                                                           auVar83._16_4_,
                                                                           CONCAT412(fVar136 * 
                                                  pfVar3[3] + auVar83._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + auVar83._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    auVar83._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    auVar83._0_4_))))))));
                pfVar3 = (float *)((long)local_2c8 + lVar37);
                pfVar4 = (float *)((long)pvVar75 + lVar37);
                auVar98 = ZEXT3264(CONCAT428(fVar130 + auVar98._28_4_,
                                             CONCAT424(fVar129 * pfVar3[6] + auVar98._24_4_,
                                                       CONCAT420(fVar137 * pfVar3[5] +
                                                                 auVar98._20_4_,
                                                                 CONCAT416(fVar128 * pfVar3[4] +
                                                                           auVar98._16_4_,
                                                                           CONCAT412(fVar136 * 
                                                  pfVar3[3] + auVar98._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + auVar98._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    auVar98._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    auVar98._0_4_))))))));
                fVar148 = in_ZMM10._28_4_;
                auVar120 = ZEXT3264(CONCAT428(fVar148 + auVar120._28_4_,
                                              CONCAT424(fVar129 * pfVar4[6] + auVar120._24_4_,
                                                        CONCAT420(fVar137 * pfVar4[5] +
                                                                  auVar120._20_4_,
                                                                  CONCAT416(fVar128 * pfVar4[4] +
                                                                            auVar120._16_4_,
                                                                            CONCAT412(fVar136 * 
                                                  pfVar4[3] + auVar120._12_4_,
                                                  CONCAT48(fVar127 * pfVar4[2] + auVar120._8_4_,
                                                           CONCAT44(fVar131 * pfVar4[1] +
                                                                    auVar120._4_4_,
                                                                    fVar121 * *pfVar4 +
                                                                    auVar120._0_4_))))))));
                pfVar3 = (float *)((long)pvVar72 + lVar37);
                auVar126 = ZEXT3264(CONCAT428(fVar130 + auVar126._28_4_,
                                              CONCAT424(fVar129 * pfVar3[6] + auVar126._24_4_,
                                                        CONCAT420(fVar137 * pfVar3[5] +
                                                                  auVar126._20_4_,
                                                                  CONCAT416(fVar128 * pfVar3[4] +
                                                                            auVar126._16_4_,
                                                                            CONCAT412(fVar136 * 
                                                  pfVar3[3] + auVar126._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + auVar126._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    auVar126._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    auVar126._0_4_))))))));
                pfVar3 = (float *)((long)pvVar61 + lVar37);
                auVar135 = ZEXT3264(CONCAT428(fVar130 + auVar135._28_4_,
                                              CONCAT424(fVar129 * pfVar3[6] + auVar135._24_4_,
                                                        CONCAT420(fVar137 * pfVar3[5] +
                                                                  auVar135._20_4_,
                                                                  CONCAT416(fVar128 * pfVar3[4] +
                                                                            auVar135._16_4_,
                                                                            CONCAT412(fVar136 * 
                                                  pfVar3[3] + auVar135._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + auVar135._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    auVar135._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    auVar135._0_4_))))))));
                pfVar3 = (float *)((long)pvVar46 + lVar37);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar130,CONCAT424(fVar129 * pfVar3[6],
                                                               CONCAT420(fVar137 * pfVar3[5],
                                                                         CONCAT416(fVar128 * pfVar3[
                                                  4],CONCAT412(fVar136 * pfVar3[3],
                                                               CONCAT48(fVar127 * pfVar3[2],
                                                                        CONCAT44(fVar131 * pfVar3[1]
                                                                                 ,fVar121 * *pfVar3)
                                                                       )))))));
                pfVar4 = (float *)((long)pvVar57 + lVar37);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar129 * pfVar4[6],
                                                                CONCAT420(fVar137 * pfVar4[5],
                                                                          CONCAT416(fVar128 * pfVar4
                                                  [4],CONCAT412(fVar136 * pfVar4[3],
                                                                CONCAT48(fVar127 * pfVar4[2],
                                                                         CONCAT44(fVar131 * pfVar4[1
                                                  ],fVar121 * *pfVar4))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar130 + in_ZMM6._28_4_,
                                             CONCAT424(fVar129 * pfVar3[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar137 * pfVar3[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar128 * pfVar3[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar136 * 
                                                  pfVar3[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    in_ZMM6._0_4_))))))));
                auVar145 = ZEXT3264(CONCAT428(fVar148 + auVar145._28_4_,
                                              CONCAT424(fVar129 * pfVar4[6] + auVar145._24_4_,
                                                        CONCAT420(fVar137 * pfVar4[5] +
                                                                  auVar145._20_4_,
                                                                  CONCAT416(fVar128 * pfVar4[4] +
                                                                            auVar145._16_4_,
                                                                            CONCAT412(fVar136 * 
                                                  pfVar4[3] + auVar145._12_4_,
                                                  CONCAT48(fVar127 * pfVar4[2] + auVar145._8_4_,
                                                           CONCAT44(fVar131 * pfVar4[1] +
                                                                    auVar145._4_4_,
                                                                    fVar121 * *pfVar4 +
                                                                    auVar145._0_4_))))))));
                pfVar3 = (float *)((long)local_158 + lVar37);
                auVar109 = ZEXT3264(CONCAT428(pfVar2[7] + auVar109._28_4_,
                                              CONCAT424(fVar129 * pfVar3[6] + auVar109._24_4_,
                                                        CONCAT420(fVar137 * pfVar3[5] +
                                                                  auVar109._20_4_,
                                                                  CONCAT416(fVar128 * pfVar3[4] +
                                                                            auVar109._16_4_,
                                                                            CONCAT412(fVar136 * 
                                                  pfVar3[3] + auVar109._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + auVar109._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    auVar109._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    auVar109._0_4_))))))));
                lVar37 = lVar37 + 0x20;
                iVar24 = iVar24 + -1;
              } while (1 < iVar24);
              local_170 = (void *)((long)local_168 + lVar37);
              local_178 = (void *)((long)local_2c8 + lVar37);
              local_180 = (void *)((long)pvVar75 + lVar37);
              pvVar40 = (void *)((long)pvVar72 + lVar37);
              local_188 = (void *)((long)pvVar61 + lVar37);
              pvVar33 = (void *)((long)pvVar46 + lVar37);
              pvVar73 = (void *)((long)pvVar57 + lVar37);
              pvVar38 = (void *)(lVar37 + (long)local_158);
              pvVar65 = (void *)((long)pvVar70 + lVar37);
            }
            auVar123 = auVar126._0_32_;
            auVar144 = auVar145._0_32_;
            auVar91 = auVar98._0_32_;
            auVar77 = auVar83._0_32_;
            auVar112 = auVar120._0_32_;
            auVar132 = auVar135._0_32_;
            auVar101 = auVar109._0_32_;
            if (iVar42 < 1) {
              pvVar51 = (void *)(lVar43 * uVar62 + (long)pvVar44);
              local_2f0 = (void *)((uVar62 + uVar52) * lVar43 + (long)pvVar44);
              local_278 = (void *)((uVar62 + uVar59) * lVar43 + (long)pvVar44);
              local_218 = (void *)((uVar62 + uVar63) * lVar43 + (long)pvVar44);
              pvVar54 = (void *)(lVar43 * uVar67 + (long)pvVar44);
              local_2f8 = (void *)(lVar64 * lVar43 + (long)pvVar44);
              local_2e0 = (void *)(lVar32 * lVar43 + (long)pvVar44);
              pvVar49 = (void *)(lVar48 * lVar43 + (long)pvVar44);
              pvVar58 = pvVar50;
            }
            else {
              lVar32 = 0;
              iVar24 = iVar42 + 1;
              do {
                pfVar2 = (float *)((long)pvVar50 + lVar32);
                fVar121 = *pfVar2;
                fVar131 = pfVar2[1];
                fVar127 = pfVar2[2];
                fVar136 = pfVar2[3];
                fVar128 = pfVar2[4];
                fVar137 = pfVar2[5];
                fVar129 = pfVar2[6];
                pfVar3 = (float *)((long)pvVar39 + lVar32);
                auVar77._0_4_ = fVar121 * *pfVar3 + auVar83._0_4_;
                auVar77._4_4_ = fVar131 * pfVar3[1] + auVar83._4_4_;
                auVar77._8_4_ = fVar127 * pfVar3[2] + auVar83._8_4_;
                auVar77._12_4_ = fVar136 * pfVar3[3] + auVar83._12_4_;
                auVar77._16_4_ = fVar128 * pfVar3[4] + auVar83._16_4_;
                auVar77._20_4_ = fVar137 * pfVar3[5] + auVar83._20_4_;
                auVar77._24_4_ = fVar129 * pfVar3[6] + auVar83._24_4_;
                fVar130 = in_ZMM9._28_4_;
                auVar77._28_4_ = fVar130 + auVar83._28_4_;
                auVar83 = ZEXT3264(auVar77);
                pfVar3 = (float *)((long)pvVar60 + lVar32);
                pfVar4 = (float *)((long)pvVar31 + lVar32);
                auVar91._0_4_ = fVar121 * *pfVar3 + auVar98._0_4_;
                auVar91._4_4_ = fVar131 * pfVar3[1] + auVar98._4_4_;
                auVar91._8_4_ = fVar127 * pfVar3[2] + auVar98._8_4_;
                auVar91._12_4_ = fVar136 * pfVar3[3] + auVar98._12_4_;
                auVar91._16_4_ = fVar128 * pfVar3[4] + auVar98._16_4_;
                auVar91._20_4_ = fVar137 * pfVar3[5] + auVar98._20_4_;
                auVar91._24_4_ = fVar129 * pfVar3[6] + auVar98._24_4_;
                auVar91._28_4_ = fVar130 + auVar98._28_4_;
                auVar98 = ZEXT3264(auVar91);
                auVar112._0_4_ = fVar121 * *pfVar4 + auVar120._0_4_;
                auVar112._4_4_ = fVar131 * pfVar4[1] + auVar120._4_4_;
                auVar112._8_4_ = fVar127 * pfVar4[2] + auVar120._8_4_;
                auVar112._12_4_ = fVar136 * pfVar4[3] + auVar120._12_4_;
                auVar112._16_4_ = fVar128 * pfVar4[4] + auVar120._16_4_;
                auVar112._20_4_ = fVar137 * pfVar4[5] + auVar120._20_4_;
                auVar112._24_4_ = fVar129 * pfVar4[6] + auVar120._24_4_;
                fVar148 = in_ZMM10._28_4_;
                auVar112._28_4_ = fVar148 + auVar120._28_4_;
                auVar120 = ZEXT3264(auVar112);
                pfVar3 = (float *)((long)local_160 + lVar32);
                auVar123._0_4_ = fVar121 * *pfVar3 + auVar126._0_4_;
                auVar123._4_4_ = fVar131 * pfVar3[1] + auVar126._4_4_;
                auVar123._8_4_ = fVar127 * pfVar3[2] + auVar126._8_4_;
                auVar123._12_4_ = fVar136 * pfVar3[3] + auVar126._12_4_;
                auVar123._16_4_ = fVar128 * pfVar3[4] + auVar126._16_4_;
                auVar123._20_4_ = fVar137 * pfVar3[5] + auVar126._20_4_;
                auVar123._24_4_ = fVar129 * pfVar3[6] + auVar126._24_4_;
                auVar123._28_4_ = fVar130 + auVar126._28_4_;
                auVar126 = ZEXT3264(auVar123);
                pfVar3 = (float *)((long)pvVar68 + lVar32);
                auVar132._0_4_ = fVar121 * *pfVar3 + auVar135._0_4_;
                auVar132._4_4_ = fVar131 * pfVar3[1] + auVar135._4_4_;
                auVar132._8_4_ = fVar127 * pfVar3[2] + auVar135._8_4_;
                auVar132._12_4_ = fVar136 * pfVar3[3] + auVar135._12_4_;
                auVar132._16_4_ = fVar128 * pfVar3[4] + auVar135._16_4_;
                auVar132._20_4_ = fVar137 * pfVar3[5] + auVar135._20_4_;
                auVar132._24_4_ = fVar129 * pfVar3[6] + auVar135._24_4_;
                auVar132._28_4_ = fVar130 + auVar135._28_4_;
                auVar135 = ZEXT3264(auVar132);
                pfVar3 = (float *)((long)local_300 + lVar32);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar130,CONCAT424(fVar129 * pfVar3[6],
                                                               CONCAT420(fVar137 * pfVar3[5],
                                                                         CONCAT416(fVar128 * pfVar3[
                                                  4],CONCAT412(fVar136 * pfVar3[3],
                                                               CONCAT48(fVar127 * pfVar3[2],
                                                                        CONCAT44(fVar131 * pfVar3[1]
                                                                                 ,fVar121 * *pfVar3)
                                                                       )))))));
                pfVar4 = (float *)((long)pvVar47 + lVar32);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar148,CONCAT424(fVar129 * pfVar4[6],
                                                                CONCAT420(fVar137 * pfVar4[5],
                                                                          CONCAT416(fVar128 * pfVar4
                                                  [4],CONCAT412(fVar136 * pfVar4[3],
                                                                CONCAT48(fVar127 * pfVar4[2],
                                                                         CONCAT44(fVar131 * pfVar4[1
                                                  ],fVar121 * *pfVar4))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar130 + in_ZMM6._28_4_,
                                             CONCAT424(fVar129 * pfVar3[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar137 * pfVar3[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar128 * pfVar3[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar136 * 
                                                  pfVar3[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    in_ZMM6._0_4_))))))));
                auVar144._0_4_ = fVar121 * *pfVar4 + auVar145._0_4_;
                auVar144._4_4_ = fVar131 * pfVar4[1] + auVar145._4_4_;
                auVar144._8_4_ = fVar127 * pfVar4[2] + auVar145._8_4_;
                auVar144._12_4_ = fVar136 * pfVar4[3] + auVar145._12_4_;
                auVar144._16_4_ = fVar128 * pfVar4[4] + auVar145._16_4_;
                auVar144._20_4_ = fVar137 * pfVar4[5] + auVar145._20_4_;
                auVar144._24_4_ = fVar129 * pfVar4[6] + auVar145._24_4_;
                auVar144._28_4_ = fVar148 + auVar145._28_4_;
                auVar145 = ZEXT3264(auVar144);
                pfVar3 = (float *)((long)pvVar74 + lVar32);
                auVar101._0_4_ = fVar121 * *pfVar3 + auVar109._0_4_;
                auVar101._4_4_ = fVar131 * pfVar3[1] + auVar109._4_4_;
                auVar101._8_4_ = fVar127 * pfVar3[2] + auVar109._8_4_;
                auVar101._12_4_ = fVar136 * pfVar3[3] + auVar109._12_4_;
                auVar101._16_4_ = fVar128 * pfVar3[4] + auVar109._16_4_;
                auVar101._20_4_ = fVar137 * pfVar3[5] + auVar109._20_4_;
                auVar101._24_4_ = fVar129 * pfVar3[6] + auVar109._24_4_;
                auVar101._28_4_ = pfVar2[7] + auVar109._28_4_;
                auVar109 = ZEXT3264(auVar101);
                lVar32 = lVar32 + 0x20;
                iVar24 = iVar24 + -1;
              } while (1 < iVar24);
              pvVar51 = (void *)((long)pvVar39 + lVar32);
              local_2f0 = (void *)((long)pvVar60 + lVar32);
              local_278 = (void *)((long)pvVar31 + lVar32);
              local_218 = (void *)((long)local_160 + lVar32);
              pvVar54 = (void *)((long)pvVar68 + lVar32);
              local_2f8 = (void *)((long)local_300 + lVar32);
              local_2e0 = (void *)((long)pvVar47 + lVar32);
              pvVar49 = (void *)(lVar32 + (long)pvVar74);
              pvVar58 = (void *)((long)pvVar50 + lVar32);
            }
            auVar101 = vhaddps_avx(auVar144,auVar101);
            auVar132 = vhaddps_avx(auVar132,in_ZMM6._0_32_);
            in_ZMM5 = ZEXT3264(auVar132);
            auVar101 = vhaddps_avx(auVar132,auVar101);
            auVar112 = vhaddps_avx(auVar112,auVar123);
            auVar77 = vhaddps_avx(auVar77,auVar91);
            auVar91 = vhaddps_avx(auVar77,auVar112);
            auVar77 = vblendps_avx(auVar91,auVar101,0xf0);
            auVar90 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar71 + uVar67 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar71 + uVar67 * 4 + lVar27)),0x10);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar71 +
                                                             uVar67 * 4 + lVar27 * 2)),0x20);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar71 +
                                                             uVar67 * 4 + lVar27 * 3)),0x30);
            in_ZMM3 = ZEXT1664(auVar90);
            auVar91 = vperm2f128_avx(auVar91,auVar101,0x21);
            auVar146 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar71 + uVar62 * 4)),
                                     ZEXT416(*(uint *)((long)pvVar71 + uVar62 * 4 + lVar27)),0x10);
            auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)((long)pvVar71 +
                                                               uVar62 * 4 + lVar27 * 2)),0x20);
            auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)((long)pvVar71 +
                                                               uVar62 * 4 + lVar27 * 3)),0x30);
            auVar83 = ZEXT3264(CONCAT428(auVar77._28_4_ + auVar91._28_4_ + auVar90._12_4_,
                                         CONCAT424(auVar77._24_4_ + auVar91._24_4_ + auVar90._8_4_,
                                                   CONCAT420(auVar77._20_4_ + auVar91._20_4_ +
                                                             auVar90._4_4_,
                                                             CONCAT416(auVar77._16_4_ +
                                                                       auVar91._16_4_ +
                                                                       auVar90._0_4_,
                                                                       CONCAT412(auVar77._12_4_ +
                                                                                 auVar91._12_4_ +
                                                                                 auVar146._12_4_,
                                                                                 CONCAT48(auVar77.
                                                  _8_4_ + auVar91._8_4_ + auVar146._8_4_,
                                                  CONCAT44(auVar77._4_4_ + auVar91._4_4_ +
                                                           auVar146._4_4_,
                                                           auVar77._0_4_ + auVar91._0_4_ +
                                                           auVar146._0_4_))))))));
            if ((uVar5 & 7) != 0) {
              lVar32 = 0;
              iVar24 = iVar34;
              do {
                auVar90 = vinsertps_avx(ZEXT416(*(uint *)((long)local_188 + lVar32)),
                                        ZEXT416(*(uint *)((long)pvVar33 + lVar32)),0x10);
                auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar73 + lVar32)),0x20);
                auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar38 + lVar32)),0x30);
                auVar146 = vinsertps_avx(ZEXT416(*(uint *)((long)local_170 + lVar32)),
                                         ZEXT416(*(uint *)((long)local_178 + lVar32)),0x10);
                auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)((long)local_180 + lVar32)),0x20)
                ;
                auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)((long)pvVar40 + lVar32)),0x30);
                fVar121 = *(float *)((long)pvVar65 + lVar32);
                auVar83 = ZEXT3264(CONCAT428(auVar90._12_4_ + auVar83._28_4_,
                                             CONCAT424(auVar90._8_4_ * fVar121 + auVar83._24_4_,
                                                       CONCAT420(auVar90._4_4_ * fVar121 +
                                                                 auVar83._20_4_,
                                                                 CONCAT416(auVar90._0_4_ * fVar121 +
                                                                           auVar83._16_4_,
                                                                           CONCAT412(auVar146._12_4_
                                                                                     * fVar121 +
                                                                                     auVar83._12_4_,
                                                                                     CONCAT48(
                                                  auVar146._8_4_ * fVar121 + auVar83._8_4_,
                                                  CONCAT44(auVar146._4_4_ * fVar121 + auVar83._4_4_,
                                                           auVar146._0_4_ * fVar121 + auVar83._0_4_)
                                                  )))))));
                lVar32 = lVar32 + 4;
                iVar24 = iVar24 + -1;
              } while (1 < iVar24);
            }
            auVar78 = auVar83._0_32_;
            if ((_w & 7) != 0) {
              lVar32 = 0;
              iVar24 = iVar35;
              do {
                auVar90 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar54 + lVar32)),
                                        ZEXT416(*(uint *)((long)local_2f8 + lVar32)),0x10);
                auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)local_2e0 + lVar32)),0x20);
                auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar49 + lVar32)),0x30);
                auVar146 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar51 + lVar32)),
                                         ZEXT416(*(uint *)((long)local_2f0 + lVar32)),0x10);
                auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)((long)local_278 + lVar32)),0x20)
                ;
                auVar146 = vinsertps_avx(auVar146,ZEXT416(*(uint *)((long)local_218 + lVar32)),0x30)
                ;
                fVar121 = *(float *)((long)pvVar58 + lVar32);
                auVar78._0_4_ = auVar146._0_4_ * fVar121 + auVar83._0_4_;
                auVar78._4_4_ = auVar146._4_4_ * fVar121 + auVar83._4_4_;
                auVar78._8_4_ = auVar146._8_4_ * fVar121 + auVar83._8_4_;
                auVar78._12_4_ = auVar146._12_4_ * fVar121 + auVar83._12_4_;
                auVar78._16_4_ = auVar90._0_4_ * fVar121 + auVar83._16_4_;
                auVar78._20_4_ = auVar90._4_4_ * fVar121 + auVar83._20_4_;
                auVar78._24_4_ = auVar90._8_4_ * fVar121 + auVar83._24_4_;
                auVar78._28_4_ = auVar90._12_4_ + auVar83._28_4_;
                auVar83 = ZEXT3264(auVar78);
                lVar32 = lVar32 + 4;
                iVar24 = iVar24 + -1;
              } while (1 < iVar24);
            }
            *(int *)((long)(_func_int ***)local_78.data + uVar62 * 4) = auVar78._0_4_;
            auVar90 = auVar78._0_16_;
            uVar7 = vextractps_avx(auVar90,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar62 * 4 + lVar28) = uVar7;
            uVar7 = vextractps_avx(auVar90,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar62 * 4 + lVar28 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar90,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar62 * 4 + lVar28 * 3) = uVar7;
            auVar90 = auVar78._16_16_;
            *(int *)((long)(_func_int ***)local_78.data + uVar67 * 4) = auVar78._16_4_;
            uVar7 = vextractps_avx(auVar90,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar67 * 4 + lVar28) = uVar7;
            uVar7 = vextractps_avx(auVar90,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar67 * 4 + lVar28 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar90,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar67 * 4 + lVar28 * 3) = uVar7;
            lVar32 = uVar62 + 3;
            local_168 = (void *)((long)local_168 + lVar29);
            local_2c8 = (void *)((long)local_2c8 + lVar29);
            pvVar75 = (void *)((long)pvVar75 + lVar29);
            pvVar72 = (void *)((long)pvVar72 + lVar29);
            pvVar61 = (void *)((long)pvVar61 + lVar29);
            pvVar46 = (void *)((long)pvVar46 + lVar29);
            pvVar57 = (void *)((long)pvVar57 + lVar29);
            local_158 = (void *)((long)local_158 + lVar29);
            pvVar39 = (void *)((long)pvVar39 + lVar30);
            pvVar60 = (void *)((long)pvVar60 + lVar30);
            pvVar31 = (void *)((long)pvVar31 + lVar30);
            local_160 = (void *)((long)local_160 + lVar30);
            pvVar68 = (void *)((long)pvVar68 + lVar30);
            local_300 = (void *)((long)local_300 + lVar30);
            pvVar47 = (void *)((long)pvVar47 + lVar30);
            pvVar74 = (void *)((long)pvVar74 + lVar30);
            uVar62 = uVar62 + 2;
          } while (lVar32 < (long)uVar53);
        }
        auVar143._8_4_ = 0x3f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        auVar143._12_4_ = 0x3f800000;
        auVar143._16_4_ = 0x3f800000;
        auVar143._20_4_ = 0x3f800000;
        auVar143._24_4_ = 0x3f800000;
        auVar143._28_4_ = 0x3f800000;
        if ((uint)uVar56 != _w) {
          pvVar44 = (void *)(bottom_blob->w * lVar26 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar61 = bias_c->data;
          lVar29 = (long)bias_c->w * bias_c->elemsize;
          lVar30 = (long)local_78.w * local_78.elemsize;
          lVar27 = (long)weight_xc->w * weight_xc->elemsize;
          lVar28 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar68 = weight_xc->data;
          pvVar47 = (void *)(lVar27 * lVar1 + (long)pvVar68);
          pvVar60 = (void *)(lVar27 * lVar25 + (long)pvVar68);
          pvVar57 = (void *)(lVar27 * (uVar53 + uVar56) + (long)pvVar68);
          pvVar50 = (void *)(lVar27 * uVar56 + (long)pvVar68);
          pvVar71 = weight_hc->data;
          pvVar70 = (void *)(lVar28 * lVar1 + (long)pvVar71);
          pvVar39 = (void *)(lVar28 * lVar25 + (long)pvVar71);
          pvVar46 = (void *)(lVar28 * (uVar53 + uVar56) + (long)pvVar71);
          pvVar31 = (void *)(lVar28 * uVar56 + (long)pvVar71);
          pvVar55 = hidden_state->data;
          uVar62 = uVar56;
          do {
            lVar43 = uVar62 + (long)(int)(_w * 2);
            lVar69 = uVar62 + (long)(int)(_w * 3);
            if (iVar66 < 1) {
              pvVar33 = (void *)(lVar27 * uVar62 + (long)pvVar68);
              pvVar75 = (void *)(lVar27 * (uVar62 + uVar53) + (long)pvVar68);
              pvVar74 = (void *)(lVar27 * lVar43 + (long)pvVar68);
              pvVar72 = (void *)(lVar27 * lVar69 + (long)pvVar68);
              auVar98 = ZEXT864(0);
              auVar109 = ZEXT864(0);
              in_ZMM3 = ZEXT864(0);
              auVar83 = ZEXT864(0);
              pvVar73 = pvVar44;
            }
            else {
              auVar83 = ZEXT864(0);
              lVar32 = 0;
              in_ZMM3 = ZEXT864(0);
              auVar109 = ZEXT864(0);
              auVar98 = ZEXT864(0);
              auVar120 = in_ZMM6;
              iVar24 = iVar66 + 1;
              do {
                pfVar2 = (float *)((long)pvVar44 + lVar32);
                fVar121 = *pfVar2;
                fVar131 = pfVar2[1];
                fVar127 = pfVar2[2];
                fVar136 = pfVar2[3];
                fVar128 = pfVar2[4];
                fVar137 = pfVar2[5];
                fVar129 = pfVar2[6];
                pfVar3 = (float *)((long)pvVar50 + lVar32);
                fVar130 = in_ZMM5._28_4_;
                auVar98 = ZEXT3264(CONCAT428(fVar130 + auVar98._28_4_,
                                             CONCAT424(fVar129 * pfVar3[6] + auVar98._24_4_,
                                                       CONCAT420(fVar137 * pfVar3[5] +
                                                                 auVar98._20_4_,
                                                                 CONCAT416(fVar128 * pfVar3[4] +
                                                                           auVar98._16_4_,
                                                                           CONCAT412(fVar136 * 
                                                  pfVar3[3] + auVar98._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + auVar98._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    auVar98._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    auVar98._0_4_))))))));
                pfVar4 = (float *)((long)pvVar57 + lVar32);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar130,CONCAT424(fVar129 * pfVar4[6],
                                                               CONCAT420(fVar137 * pfVar4[5],
                                                                         CONCAT416(fVar128 * pfVar4[
                                                  4],CONCAT412(fVar136 * pfVar4[3],
                                                               CONCAT48(fVar127 * pfVar4[2],
                                                                        CONCAT44(fVar131 * pfVar4[1]
                                                                                 ,fVar121 * *pfVar4)
                                                                       )))))));
                pfVar3 = (float *)((long)pvVar60 + lVar32);
                auVar126._0_4_ = fVar121 * *pfVar3;
                auVar126._4_4_ = fVar131 * pfVar3[1];
                auVar126._8_4_ = fVar127 * pfVar3[2];
                auVar126._12_4_ = fVar136 * pfVar3[3];
                auVar126._16_4_ = fVar128 * pfVar3[4];
                auVar126._20_4_ = fVar137 * pfVar3[5];
                auVar126._28_36_ = auVar120._28_36_;
                auVar126._24_4_ = fVar129 * pfVar3[6];
                in_ZMM6 = ZEXT3264(auVar126._0_32_);
                auVar109 = ZEXT3264(CONCAT428(fVar130 + auVar109._28_4_,
                                              CONCAT424(fVar129 * pfVar4[6] + auVar109._24_4_,
                                                        CONCAT420(fVar137 * pfVar4[5] +
                                                                  auVar109._20_4_,
                                                                  CONCAT416(fVar128 * pfVar4[4] +
                                                                            auVar109._16_4_,
                                                                            CONCAT412(fVar136 * 
                                                  pfVar4[3] + auVar109._12_4_,
                                                  CONCAT48(fVar127 * pfVar4[2] + auVar109._8_4_,
                                                           CONCAT44(fVar131 * pfVar4[1] +
                                                                    auVar109._4_4_,
                                                                    fVar121 * *pfVar4 +
                                                                    auVar109._0_4_))))))));
                in_ZMM3 = ZEXT3264(CONCAT428(auVar120._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar126._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar126._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar126._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar126._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar126._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar126._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar126._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar3 = (float *)((long)pvVar47 + lVar32);
                auVar83 = ZEXT3264(CONCAT428(pfVar2[7] + auVar83._28_4_,
                                             CONCAT424(fVar129 * pfVar3[6] + auVar83._24_4_,
                                                       CONCAT420(fVar137 * pfVar3[5] +
                                                                 auVar83._20_4_,
                                                                 CONCAT416(fVar128 * pfVar3[4] +
                                                                           auVar83._16_4_,
                                                                           CONCAT412(fVar136 * 
                                                  pfVar3[3] + auVar83._12_4_,
                                                  CONCAT48(fVar127 * pfVar3[2] + auVar83._8_4_,
                                                           CONCAT44(fVar131 * pfVar3[1] +
                                                                    auVar83._4_4_,
                                                                    fVar121 * *pfVar3 +
                                                                    auVar83._0_4_))))))));
                iVar24 = iVar24 + -1;
                lVar32 = lVar32 + 0x20;
                auVar120 = in_ZMM6;
              } while (1 < iVar24);
              pvVar72 = (void *)((long)pvVar47 + lVar32);
              pvVar74 = (void *)((long)pvVar60 + lVar32);
              pvVar75 = (void *)(lVar32 + (long)pvVar57);
              pvVar33 = (void *)(lVar32 + (long)pvVar50);
              pvVar73 = (void *)(lVar32 + (long)pvVar44);
            }
            auVar102 = auVar109._0_32_;
            auVar92 = auVar98._0_32_;
            auVar79 = auVar83._0_32_;
            if (iVar42 < 1) {
              pvVar51 = (void *)(lVar28 * uVar62 + (long)pvVar71);
              pvVar38 = (void *)((uVar62 + uVar53) * lVar28 + (long)pvVar71);
              pvVar65 = (void *)(lVar43 * lVar28 + (long)pvVar71);
              pvVar40 = (void *)(lVar69 * lVar28 + (long)pvVar71);
              pvVar54 = pvVar55;
            }
            else {
              lVar43 = 0;
              auVar120 = in_ZMM6;
              iVar24 = iVar42 + 1;
              do {
                pfVar2 = (float *)((long)pvVar55 + lVar43);
                fVar121 = *pfVar2;
                fVar131 = pfVar2[1];
                fVar127 = pfVar2[2];
                fVar136 = pfVar2[3];
                fVar128 = pfVar2[4];
                fVar137 = pfVar2[5];
                fVar129 = pfVar2[6];
                pfVar3 = (float *)((long)pvVar31 + lVar43);
                auVar92._0_4_ = fVar121 * *pfVar3 + auVar98._0_4_;
                auVar92._4_4_ = fVar131 * pfVar3[1] + auVar98._4_4_;
                auVar92._8_4_ = fVar127 * pfVar3[2] + auVar98._8_4_;
                auVar92._12_4_ = fVar136 * pfVar3[3] + auVar98._12_4_;
                auVar92._16_4_ = fVar128 * pfVar3[4] + auVar98._16_4_;
                auVar92._20_4_ = fVar137 * pfVar3[5] + auVar98._20_4_;
                auVar92._24_4_ = fVar129 * pfVar3[6] + auVar98._24_4_;
                fVar130 = in_ZMM5._28_4_;
                auVar92._28_4_ = fVar130 + auVar98._28_4_;
                auVar98 = ZEXT3264(auVar92);
                pfVar3 = (float *)((long)pvVar46 + lVar43);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar130,CONCAT424(fVar129 * pfVar3[6],
                                                               CONCAT420(fVar137 * pfVar3[5],
                                                                         CONCAT416(fVar128 * pfVar3[
                                                  4],CONCAT412(fVar136 * pfVar3[3],
                                                               CONCAT48(fVar127 * pfVar3[2],
                                                                        CONCAT44(fVar131 * pfVar3[1]
                                                                                 ,fVar121 * *pfVar3)
                                                                       )))))));
                pfVar4 = (float *)((long)pvVar39 + lVar43);
                auVar135._0_4_ = fVar121 * *pfVar4;
                auVar135._4_4_ = fVar131 * pfVar4[1];
                auVar135._8_4_ = fVar127 * pfVar4[2];
                auVar135._12_4_ = fVar136 * pfVar4[3];
                auVar135._16_4_ = fVar128 * pfVar4[4];
                auVar135._20_4_ = fVar137 * pfVar4[5];
                auVar135._28_36_ = auVar120._28_36_;
                auVar135._24_4_ = fVar129 * pfVar4[6];
                in_ZMM6 = ZEXT3264(auVar135._0_32_);
                auVar102._0_4_ = fVar121 * *pfVar3 + auVar109._0_4_;
                auVar102._4_4_ = fVar131 * pfVar3[1] + auVar109._4_4_;
                auVar102._8_4_ = fVar127 * pfVar3[2] + auVar109._8_4_;
                auVar102._12_4_ = fVar136 * pfVar3[3] + auVar109._12_4_;
                auVar102._16_4_ = fVar128 * pfVar3[4] + auVar109._16_4_;
                auVar102._20_4_ = fVar137 * pfVar3[5] + auVar109._20_4_;
                auVar102._24_4_ = fVar129 * pfVar3[6] + auVar109._24_4_;
                auVar102._28_4_ = fVar130 + auVar109._28_4_;
                auVar109 = ZEXT3264(auVar102);
                in_ZMM3 = ZEXT3264(CONCAT428(auVar120._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar135._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar135._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar135._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar135._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar135._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar135._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar135._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar3 = (float *)((long)pvVar70 + lVar43);
                auVar79._0_4_ = fVar121 * *pfVar3 + auVar83._0_4_;
                auVar79._4_4_ = fVar131 * pfVar3[1] + auVar83._4_4_;
                auVar79._8_4_ = fVar127 * pfVar3[2] + auVar83._8_4_;
                auVar79._12_4_ = fVar136 * pfVar3[3] + auVar83._12_4_;
                auVar79._16_4_ = fVar128 * pfVar3[4] + auVar83._16_4_;
                auVar79._20_4_ = fVar137 * pfVar3[5] + auVar83._20_4_;
                auVar79._24_4_ = fVar129 * pfVar3[6] + auVar83._24_4_;
                auVar79._28_4_ = pfVar2[7] + auVar83._28_4_;
                auVar83 = ZEXT3264(auVar79);
                iVar24 = iVar24 + -1;
                lVar43 = lVar43 + 0x20;
                auVar120 = in_ZMM6;
              } while (1 < iVar24);
              pvVar40 = (void *)((long)pvVar70 + lVar43);
              pvVar65 = (void *)((long)pvVar39 + lVar43);
              pvVar38 = (void *)((long)pvVar46 + lVar43);
              pvVar51 = (void *)((long)pvVar31 + lVar43);
              pvVar54 = (void *)(lVar43 + (long)pvVar55);
            }
            auVar77 = vhaddps_avx(in_ZMM3._0_32_,auVar79);
            auVar91 = vhaddps_avx(auVar92,auVar102);
            auVar77 = vhaddps_avx(auVar91,auVar77);
            auVar90 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar61 + uVar62 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar61 + uVar62 * 4 + lVar29)),0x10);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar61 +
                                                             uVar62 * 4 + lVar29 * 2)),0x20);
            auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar61 +
                                                             uVar62 * 4 + lVar29 * 3)),0x30);
            auVar83 = ZEXT1664(CONCAT412(auVar90._12_4_ + auVar77._12_4_ + auVar77._28_4_,
                                         CONCAT48(auVar90._8_4_ + auVar77._8_4_ + auVar77._24_4_,
                                                  CONCAT44(auVar90._4_4_ + auVar77._4_4_ +
                                                           auVar77._20_4_,
                                                           auVar90._0_4_ + auVar77._0_4_ +
                                                           auVar77._16_4_))));
            if ((uVar5 & 7) != 0) {
              lVar43 = 0;
              iVar24 = iVar34;
              do {
                auVar90 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar33 + lVar43)),
                                        ZEXT416(*(uint *)((long)pvVar75 + lVar43)),0x10);
                auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar74 + lVar43)),0x20);
                auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar72 + lVar43)),0x30);
                fVar121 = *(float *)((long)pvVar73 + lVar43);
                auVar83 = ZEXT1664(CONCAT412(auVar90._12_4_ * fVar121 + auVar83._12_4_,
                                             CONCAT48(auVar90._8_4_ * fVar121 + auVar83._8_4_,
                                                      CONCAT44(auVar90._4_4_ * fVar121 +
                                                               auVar83._4_4_,
                                                               auVar90._0_4_ * fVar121 +
                                                               auVar83._0_4_))));
                iVar24 = iVar24 + -1;
                lVar43 = lVar43 + 4;
              } while (1 < iVar24);
            }
            auVar90 = auVar83._0_16_;
            if ((uVar53 & 7) != 0) {
              lVar43 = 0;
              iVar24 = iVar35;
              do {
                auVar90 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar51 + lVar43)),
                                        ZEXT416(*(uint *)((long)pvVar38 + lVar43)),0x10);
                auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar65 + lVar43)),0x20);
                auVar146 = vinsertps_avx(auVar90,ZEXT416(*(uint *)((long)pvVar40 + lVar43)),0x30);
                fVar121 = *(float *)((long)pvVar54 + lVar43);
                auVar90._0_4_ = auVar146._0_4_ * fVar121 + auVar83._0_4_;
                auVar90._4_4_ = auVar146._4_4_ * fVar121 + auVar83._4_4_;
                auVar90._8_4_ = auVar146._8_4_ * fVar121 + auVar83._8_4_;
                auVar90._12_4_ = auVar146._12_4_ * fVar121 + auVar83._12_4_;
                auVar83 = ZEXT1664(auVar90);
                iVar24 = iVar24 + -1;
                lVar43 = lVar43 + 4;
              } while (1 < iVar24);
            }
            *(int *)((long)(_func_int ***)local_78.data + uVar62 * 4) = auVar90._0_4_;
            uVar7 = vextractps_avx(auVar90,1);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar62 * 4 + lVar30) = uVar7;
            uVar7 = vextractps_avx(auVar90,2);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar62 * 4 + lVar30 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar90,3);
            *(undefined4 *)((long)(_func_int ***)local_78.data + uVar62 * 4 + lVar30 * 3) = uVar7;
            uVar62 = uVar62 + 1;
            pvVar47 = (void *)((long)pvVar47 + lVar27);
            pvVar60 = (void *)((long)pvVar60 + lVar27);
            pvVar57 = (void *)((long)pvVar57 + lVar27);
            pvVar50 = (void *)((long)pvVar50 + lVar27);
            pvVar70 = (void *)((long)pvVar70 + lVar28);
            pvVar39 = (void *)((long)pvVar39 + lVar28);
            pvVar46 = (void *)((long)pvVar46 + lVar28);
            pvVar31 = (void *)((long)pvVar31 + lVar28);
          } while ((long)uVar62 < (long)(int)_w);
        }
        pvVar44 = (void *)(top_blob->w * lVar26 * top_blob->elemsize + (long)top_blob->data);
        lVar26 = (long)local_78.w * local_78.elemsize;
        ppp_Var41 = (_func_int ***)((long)(_func_int ***)local_78.data + lVar26);
        pvVar55 = (void *)((long)(_func_int ***)local_78.data + lVar26 * 3);
        pvVar68 = cell_state->data;
        pvVar71 = hidden_state->data;
        pvVar61 = (void *)((long)(_func_int ***)local_78.data + lVar26 * 2);
        pAVar45 = (Allocator *)local_78.data;
        if (0 < iVar42) {
          auVar146._8_4_ = 0x3f800000;
          auVar146._0_8_ = 0x3f8000003f800000;
          auVar146._12_4_ = 0x3f800000;
          in_ZMM9 = ZEXT1664(auVar146);
          lVar26 = 0;
          iVar24 = iVar42 + 1;
          do {
            lVar29 = lVar26;
            auVar77 = *(undefined1 (*) [32])((long)(_func_int ***)local_78.data + lVar29);
            auVar80._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
            auVar80._8_4_ = auVar77._8_4_ ^ 0x80000000;
            auVar80._12_4_ = auVar77._12_4_ ^ 0x80000000;
            auVar80._16_4_ = auVar77._16_4_ ^ 0x80000000;
            auVar80._20_4_ = auVar77._20_4_ ^ 0x80000000;
            auVar80._24_4_ = auVar77._24_4_ ^ 0x80000000;
            auVar80._28_4_ = auVar77._28_4_ ^ 0x80000000;
            auVar147._8_4_ = 0x42b0c0a5;
            auVar147._0_8_ = 0x42b0c0a542b0c0a5;
            auVar147._12_4_ = 0x42b0c0a5;
            auVar147._16_4_ = 0x42b0c0a5;
            auVar147._20_4_ = 0x42b0c0a5;
            auVar147._24_4_ = 0x42b0c0a5;
            auVar147._28_4_ = 0x42b0c0a5;
            in_ZMM10 = ZEXT3264(auVar147);
            auVar77 = vminps_avx(auVar147,auVar80);
            auVar93._8_4_ = 0xc2b0c0a5;
            auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar93._12_4_ = 0xc2b0c0a5;
            auVar93._16_4_ = 0xc2b0c0a5;
            auVar93._20_4_ = 0xc2b0c0a5;
            auVar93._24_4_ = 0xc2b0c0a5;
            auVar93._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar77,auVar93);
            auVar94._0_4_ = auVar91._0_4_ * 1.442695 + 0.5;
            auVar94._4_4_ = auVar91._4_4_ * 1.442695 + 0.5;
            auVar94._8_4_ = auVar91._8_4_ * 1.442695 + 0.5;
            auVar94._12_4_ = auVar91._12_4_ * 1.442695 + 0.5;
            auVar94._16_4_ = auVar91._16_4_ * 1.442695 + 0.5;
            auVar94._20_4_ = auVar91._20_4_ * 1.442695 + 0.5;
            auVar94._24_4_ = auVar91._24_4_ * 1.442695 + 0.5;
            auVar94._28_4_ = 0xc2afc0a5;
            auVar101 = vroundps_avx(auVar94,1);
            auVar77 = vcmpps_avx(auVar94,auVar101,1);
            auVar77 = vandps_avx(auVar77,auVar143);
            auVar77 = vsubps_avx(auVar101,auVar77);
            auVar10._4_4_ = auVar77._4_4_ * 0.6931472;
            auVar10._0_4_ = auVar77._0_4_ * 0.6931472;
            auVar10._8_4_ = auVar77._8_4_ * 0.6931472;
            auVar10._12_4_ = auVar77._12_4_ * 0.6931472;
            auVar10._16_4_ = auVar77._16_4_ * 0.6931472;
            auVar10._20_4_ = auVar77._20_4_ * 0.6931472;
            auVar10._24_4_ = auVar77._24_4_ * 0.6931472;
            auVar10._28_4_ = auVar101._28_4_;
            auVar91 = vsubps_avx(auVar91,auVar10);
            fVar121 = auVar91._0_4_;
            fVar131 = auVar91._4_4_;
            fVar127 = auVar91._8_4_;
            fVar136 = auVar91._12_4_;
            fVar128 = auVar91._16_4_;
            fVar137 = auVar91._20_4_;
            fVar129 = auVar91._24_4_;
            auVar99._0_4_ = (int)auVar77._0_4_;
            auVar99._4_4_ = (int)auVar77._4_4_;
            auVar99._8_4_ = (int)auVar77._8_4_;
            auVar99._12_4_ = (int)auVar77._12_4_;
            auVar95._16_4_ = (int)auVar77._16_4_;
            auVar95._0_16_ = auVar99;
            auVar95._20_4_ = (int)auVar77._20_4_;
            auVar95._24_4_ = (int)auVar77._24_4_;
            auVar95._28_4_ = (int)auVar77._28_4_;
            auVar99 = vpslld_avx(auVar99,0x17);
            auVar90 = vpslld_avx(auVar95._16_16_,0x17);
            auVar90 = vpaddd_avx(auVar146,auVar90);
            auVar99 = vpaddd_avx(auVar146,auVar99);
            auVar103._0_4_ =
                 (fVar121 + 1.0 +
                 fVar121 * fVar121 *
                 (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) * fVar121 +
                   0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5)) * auVar99._0_4_ + 1.0;
            auVar103._4_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar99._4_4_ + 1.0;
            auVar103._8_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar99._8_4_ + 1.0;
            auVar103._12_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar99._12_4_ + 1.0;
            auVar103._16_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar103._20_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar103._24_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar103._28_4_ = auVar91._28_4_ + 1.0 + auVar101._28_4_ + 1.0;
            auVar101 = vrcpps_avx(auVar103);
            pfVar2 = (float *)((long)pvVar55 + lVar29);
            auVar11._4_4_ = pfVar2[1] * -2.0;
            auVar11._0_4_ = *pfVar2 * -2.0;
            auVar11._8_4_ = pfVar2[2] * -2.0;
            auVar11._12_4_ = pfVar2[3] * -2.0;
            auVar11._16_4_ = pfVar2[4] * -2.0;
            auVar11._20_4_ = pfVar2[5] * -2.0;
            auVar11._24_4_ = pfVar2[6] * -2.0;
            auVar11._28_4_ = 0xc0000000;
            auVar77 = vminps_avx(auVar147,auVar11);
            auVar91 = vmaxps_avx(auVar77,auVar93);
            auVar113._0_4_ = auVar91._0_4_ * 1.442695 + 0.5;
            auVar113._4_4_ = auVar91._4_4_ * 1.442695 + 0.5;
            auVar113._8_4_ = auVar91._8_4_ * 1.442695 + 0.5;
            auVar113._12_4_ = auVar91._12_4_ * 1.442695 + 0.5;
            auVar113._16_4_ = auVar91._16_4_ * 1.442695 + 0.5;
            auVar113._20_4_ = auVar91._20_4_ * 1.442695 + 0.5;
            auVar113._24_4_ = auVar91._24_4_ * 1.442695 + 0.5;
            auVar113._28_4_ =
                 in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
            auVar112 = vroundps_avx(auVar113,1);
            auVar77 = vcmpps_avx(auVar113,auVar112,1);
            auVar77 = vandps_avx(auVar77,auVar143);
            auVar77 = vsubps_avx(auVar112,auVar77);
            auVar12._4_4_ = auVar77._4_4_ * 0.6931472;
            auVar12._0_4_ = auVar77._0_4_ * 0.6931472;
            auVar12._8_4_ = auVar77._8_4_ * 0.6931472;
            auVar12._12_4_ = auVar77._12_4_ * 0.6931472;
            auVar12._16_4_ = auVar77._16_4_ * 0.6931472;
            auVar12._20_4_ = auVar77._20_4_ * 0.6931472;
            auVar12._24_4_ = auVar77._24_4_ * 0.6931472;
            auVar12._28_4_ = auVar112._28_4_;
            auVar91 = vsubps_avx(auVar91,auVar12);
            fVar121 = auVar91._0_4_;
            fVar131 = auVar91._4_4_;
            fVar127 = auVar91._8_4_;
            fVar136 = auVar91._12_4_;
            fVar128 = auVar91._16_4_;
            fVar137 = auVar91._20_4_;
            fVar129 = auVar91._24_4_;
            auVar110._0_4_ = (int)auVar77._0_4_;
            auVar110._4_4_ = (int)auVar77._4_4_;
            auVar110._8_4_ = (int)auVar77._8_4_;
            auVar110._12_4_ = (int)auVar77._12_4_;
            auVar114._16_4_ = (int)auVar77._16_4_;
            auVar114._0_16_ = auVar110;
            auVar114._20_4_ = (int)auVar77._20_4_;
            auVar114._24_4_ = (int)auVar77._24_4_;
            auVar114._28_4_ = (int)auVar77._28_4_;
            auVar99 = vpslld_avx(auVar110,0x17);
            auVar90 = vpslld_avx(auVar114._16_16_,0x17);
            auVar90 = vpaddd_avx(auVar146,auVar90);
            auVar99 = vpaddd_avx(auVar146,auVar99);
            auVar81._0_4_ =
                 (fVar121 + 1.0 +
                 fVar121 * fVar121 *
                 (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) * fVar121 +
                   0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5)) * auVar99._0_4_ + 1.0;
            auVar81._4_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar99._4_4_ + 1.0;
            auVar81._8_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar99._8_4_ + 1.0;
            auVar81._12_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar99._12_4_ + 1.0;
            auVar81._16_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar81._20_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar81._24_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar81._28_4_ = auVar91._28_4_ + 1.0 + auVar112._28_4_ + 1.0;
            auVar77 = vrcpps_avx(auVar81);
            fVar121 = auVar77._0_4_;
            fVar131 = auVar77._4_4_;
            fVar127 = auVar77._8_4_;
            fVar136 = auVar77._12_4_;
            fVar128 = auVar77._16_4_;
            fVar137 = auVar77._20_4_;
            fVar129 = auVar77._24_4_;
            auVar13._4_4_ = auVar81._4_4_ * (fVar131 + fVar131);
            auVar13._0_4_ = auVar81._0_4_ * (fVar121 + fVar121);
            auVar13._8_4_ = auVar81._8_4_ * (fVar127 + fVar127);
            auVar13._12_4_ = auVar81._12_4_ * (fVar136 + fVar136);
            auVar13._16_4_ = auVar81._16_4_ * (fVar128 + fVar128);
            auVar13._20_4_ = auVar81._20_4_ * (fVar137 + fVar137);
            auVar13._24_4_ = auVar81._24_4_ * (fVar129 + fVar129);
            auVar13._28_4_ = auVar81._28_4_;
            auVar133._8_4_ = 0x40000000;
            auVar133._0_8_ = 0x4000000040000000;
            auVar133._12_4_ = 0x40000000;
            auVar133._16_4_ = 0x40000000;
            auVar133._20_4_ = 0x40000000;
            auVar133._24_4_ = 0x40000000;
            auVar133._28_4_ = 0x40000000;
            auVar91 = vsubps_avx(auVar133,auVar13);
            fVar130 = auVar91._28_4_;
            auVar115._0_4_ = fVar121 + fVar121 + -1.0 + fVar121 * auVar91._0_4_;
            auVar115._4_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar91._4_4_;
            auVar115._8_4_ = fVar127 + fVar127 + -1.0 + fVar127 * auVar91._8_4_;
            auVar115._12_4_ = fVar136 + fVar136 + -1.0 + fVar136 * auVar91._12_4_;
            auVar115._16_4_ = fVar128 + fVar128 + -1.0 + fVar128 * auVar91._16_4_;
            auVar115._20_4_ = fVar137 + fVar137 + -1.0 + fVar137 * auVar91._20_4_;
            auVar115._24_4_ = fVar129 + fVar129 + -1.0 + fVar129 * auVar91._24_4_;
            auVar115._28_4_ = auVar77._28_4_ + auVar77._28_4_ + -1.0 + fVar130;
            fVar76 = auVar115._0_4_ * auVar101._0_4_;
            fVar84 = auVar115._4_4_ * auVar101._4_4_;
            fVar85 = auVar115._8_4_ * auVar101._8_4_;
            fVar86 = auVar115._12_4_ * auVar101._12_4_;
            fVar87 = auVar115._16_4_ * auVar101._16_4_;
            fVar88 = auVar115._20_4_ * auVar101._20_4_;
            fVar89 = auVar115._24_4_ * auVar101._24_4_;
            auVar14._4_4_ = auVar103._4_4_ * fVar84;
            auVar14._0_4_ = auVar103._0_4_ * fVar76;
            auVar14._8_4_ = auVar103._8_4_ * fVar85;
            auVar14._12_4_ = auVar103._12_4_ * fVar86;
            auVar14._16_4_ = auVar103._16_4_ * fVar87;
            auVar14._20_4_ = auVar103._20_4_ * fVar88;
            auVar14._24_4_ = auVar103._24_4_ * fVar89;
            auVar14._28_4_ = auVar103._28_4_;
            auVar132 = vsubps_avx(auVar115,auVar14);
            auVar77 = *(undefined1 (*) [32])((long)ppp_Var41 + lVar29);
            auVar104._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
            auVar104._8_4_ = auVar77._8_4_ ^ 0x80000000;
            auVar104._12_4_ = auVar77._12_4_ ^ 0x80000000;
            auVar104._16_4_ = auVar77._16_4_ ^ 0x80000000;
            auVar104._20_4_ = auVar77._20_4_ ^ 0x80000000;
            auVar104._24_4_ = auVar77._24_4_ ^ 0x80000000;
            auVar104._28_4_ = auVar77._28_4_ ^ 0x80000000;
            auVar77 = vminps_avx(auVar147,auVar104);
            auVar142._8_4_ = 0xc2b0c0a5;
            auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar142._12_4_ = 0xc2b0c0a5;
            auVar142._16_4_ = 0xc2b0c0a5;
            auVar142._20_4_ = 0xc2b0c0a5;
            auVar142._24_4_ = 0xc2b0c0a5;
            auVar142._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar77,auVar142);
            auVar116._0_4_ = auVar91._0_4_ * 1.442695 + 0.5;
            auVar116._4_4_ = auVar91._4_4_ * 1.442695 + 0.5;
            auVar116._8_4_ = auVar91._8_4_ * 1.442695 + 0.5;
            auVar116._12_4_ = auVar91._12_4_ * 1.442695 + 0.5;
            auVar116._16_4_ = auVar91._16_4_ * 1.442695 + 0.5;
            auVar116._20_4_ = auVar91._20_4_ * 1.442695 + 0.5;
            auVar116._24_4_ = auVar91._24_4_ * 1.442695 + 0.5;
            auVar116._28_4_ = auVar115._28_4_ + 0.5;
            auVar112 = vroundps_avx(auVar116,1);
            auVar77 = vcmpps_avx(auVar116,auVar112,1);
            auVar77 = vandps_avx(auVar77,auVar143);
            auVar77 = vsubps_avx(auVar112,auVar77);
            auVar15._4_4_ = auVar77._4_4_ * 0.6931472;
            auVar15._0_4_ = auVar77._0_4_ * 0.6931472;
            auVar15._8_4_ = auVar77._8_4_ * 0.6931472;
            auVar15._12_4_ = auVar77._12_4_ * 0.6931472;
            auVar15._16_4_ = auVar77._16_4_ * 0.6931472;
            auVar15._20_4_ = auVar77._20_4_ * 0.6931472;
            auVar15._24_4_ = auVar77._24_4_ * 0.6931472;
            auVar15._28_4_ = auVar112._28_4_;
            auVar91 = vsubps_avx(auVar91,auVar15);
            fVar121 = auVar91._0_4_;
            fVar131 = auVar91._4_4_;
            fVar127 = auVar91._8_4_;
            fVar136 = auVar91._12_4_;
            fVar128 = auVar91._16_4_;
            fVar137 = auVar91._20_4_;
            fVar129 = auVar91._24_4_;
            auVar111._0_4_ = (int)auVar77._0_4_;
            auVar111._4_4_ = (int)auVar77._4_4_;
            auVar111._8_4_ = (int)auVar77._8_4_;
            auVar111._12_4_ = (int)auVar77._12_4_;
            auVar117._16_4_ = (int)auVar77._16_4_;
            auVar117._0_16_ = auVar111;
            auVar117._20_4_ = (int)auVar77._20_4_;
            auVar117._24_4_ = (int)auVar77._24_4_;
            auVar117._28_4_ = (int)auVar77._28_4_;
            auVar99 = vpslld_avx(auVar111,0x17);
            auVar90 = vpslld_avx(auVar117._16_16_,0x17);
            auVar90 = vpaddd_avx(auVar146,auVar90);
            auVar99 = vpaddd_avx(auVar146,auVar99);
            auVar105._0_4_ =
                 (fVar121 + 1.0 +
                 fVar121 * fVar121 *
                 (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) * fVar121 +
                   0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5)) * auVar99._0_4_ + 1.0;
            auVar105._4_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar99._4_4_ + 1.0;
            auVar105._8_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar99._8_4_ + 1.0;
            auVar105._12_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar99._12_4_ + 1.0;
            auVar105._16_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar105._20_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar105._24_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar105._28_4_ = auVar91._28_4_ + 1.0 + auVar112._28_4_ + 1.0;
            auVar112 = vrcpps_avx(auVar105);
            auVar77 = *(undefined1 (*) [32])((long)pvVar68 + lVar29);
            fVar131 = auVar77._0_4_ * auVar112._0_4_;
            fVar136 = auVar77._4_4_ * auVar112._4_4_;
            fVar137 = auVar77._8_4_ * auVar112._8_4_;
            fVar138 = auVar77._12_4_ * auVar112._12_4_;
            fVar139 = auVar77._16_4_ * auVar112._16_4_;
            fVar140 = auVar77._20_4_ * auVar112._20_4_;
            fVar141 = auVar77._24_4_ * auVar112._24_4_;
            auVar16._4_4_ = auVar105._4_4_ * fVar136;
            auVar16._0_4_ = auVar105._0_4_ * fVar131;
            auVar16._8_4_ = auVar105._8_4_ * fVar137;
            auVar16._12_4_ = auVar105._12_4_ * fVar138;
            auVar16._16_4_ = auVar105._16_4_ * fVar139;
            auVar16._20_4_ = auVar105._20_4_ * fVar140;
            auVar16._24_4_ = auVar105._24_4_ * fVar141;
            auVar16._28_4_ = auVar105._28_4_;
            auVar144 = vsubps_avx(auVar77,auVar16);
            auVar91 = *(undefined1 (*) [32])((long)pvVar61 + lVar29);
            auVar118._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
            auVar118._8_4_ = auVar91._8_4_ ^ 0x80000000;
            auVar118._12_4_ = auVar91._12_4_ ^ 0x80000000;
            auVar118._16_4_ = auVar91._16_4_ ^ 0x80000000;
            auVar118._20_4_ = auVar91._20_4_ ^ 0x80000000;
            auVar118._24_4_ = auVar91._24_4_ ^ 0x80000000;
            auVar118._28_4_ = auVar91._28_4_ ^ 0x80000000;
            auVar91 = vminps_avx(auVar147,auVar118);
            auVar91 = vmaxps_avx(auVar91,auVar142);
            auVar124._0_4_ = auVar91._0_4_ * 1.442695 + 0.5;
            auVar124._4_4_ = auVar91._4_4_ * 1.442695 + 0.5;
            auVar124._8_4_ = auVar91._8_4_ * 1.442695 + 0.5;
            auVar124._12_4_ = auVar91._12_4_ * 1.442695 + 0.5;
            auVar124._16_4_ = auVar91._16_4_ * 1.442695 + 0.5;
            auVar124._20_4_ = auVar91._20_4_ * 1.442695 + 0.5;
            auVar124._24_4_ = auVar91._24_4_ * 1.442695 + 0.5;
            auVar124._28_4_ = auVar77._28_4_ + 0.5;
            auVar123 = vroundps_avx(auVar124,1);
            auVar77 = vcmpps_avx(auVar124,auVar123,1);
            auVar77 = vandps_avx(auVar77,auVar143);
            auVar77 = vsubps_avx(auVar123,auVar77);
            auVar17._4_4_ = auVar77._4_4_ * 0.6931472;
            auVar17._0_4_ = auVar77._0_4_ * 0.6931472;
            auVar17._8_4_ = auVar77._8_4_ * 0.6931472;
            auVar17._12_4_ = auVar77._12_4_ * 0.6931472;
            auVar17._16_4_ = auVar77._16_4_ * 0.6931472;
            auVar17._20_4_ = auVar77._20_4_ * 0.6931472;
            auVar17._24_4_ = auVar77._24_4_ * 0.6931472;
            auVar17._28_4_ = auVar123._28_4_;
            auVar78 = vsubps_avx(auVar91,auVar17);
            fVar121 = auVar78._0_4_;
            fVar127 = auVar78._4_4_;
            fVar128 = auVar78._8_4_;
            fVar129 = auVar78._12_4_;
            fVar148 = auVar78._16_4_;
            fVar8 = auVar78._20_4_;
            fVar9 = auVar78._24_4_;
            auVar122._0_4_ = (int)auVar77._0_4_;
            auVar122._4_4_ = (int)auVar77._4_4_;
            auVar122._8_4_ = (int)auVar77._8_4_;
            auVar122._12_4_ = (int)auVar77._12_4_;
            auVar125._16_4_ = (int)auVar77._16_4_;
            auVar125._0_16_ = auVar122;
            auVar125._20_4_ = (int)auVar77._20_4_;
            auVar125._24_4_ = (int)auVar77._24_4_;
            auVar125._28_4_ = (int)auVar77._28_4_;
            auVar99 = vpslld_avx(auVar122,0x17);
            auVar90 = vpslld_avx(auVar125._16_16_,0x17);
            auVar90 = vpaddd_avx(auVar146,auVar90);
            auVar99 = vpaddd_avx(auVar146,auVar99);
            auVar82._0_4_ =
                 fVar131 + auVar112._0_4_ * auVar144._0_4_ + fVar76 +
                 auVar101._0_4_ * auVar132._0_4_;
            auVar82._4_4_ =
                 fVar136 + auVar112._4_4_ * auVar144._4_4_ + fVar84 +
                 auVar101._4_4_ * auVar132._4_4_;
            auVar82._8_4_ =
                 fVar137 + auVar112._8_4_ * auVar144._8_4_ + fVar85 +
                 auVar101._8_4_ * auVar132._8_4_;
            auVar82._12_4_ =
                 fVar138 + auVar112._12_4_ * auVar144._12_4_ + fVar86 +
                 auVar101._12_4_ * auVar132._12_4_;
            auVar82._16_4_ =
                 fVar139 + auVar112._16_4_ * auVar144._16_4_ + fVar87 +
                 auVar101._16_4_ * auVar132._16_4_;
            auVar82._20_4_ =
                 fVar140 + auVar112._20_4_ * auVar144._20_4_ + fVar88 +
                 auVar101._20_4_ * auVar132._20_4_;
            auVar82._24_4_ =
                 fVar141 + auVar112._24_4_ * auVar144._24_4_ + fVar89 +
                 auVar101._24_4_ * auVar132._24_4_;
            auVar82._28_4_ = auVar144._28_4_ + 2.718064 + fVar130 + fVar130;
            auVar18._4_4_ = auVar82._4_4_ * -2.0;
            auVar18._0_4_ = auVar82._0_4_ * -2.0;
            auVar18._8_4_ = auVar82._8_4_ * -2.0;
            auVar18._12_4_ = auVar82._12_4_ * -2.0;
            auVar18._16_4_ = auVar82._16_4_ * -2.0;
            auVar18._20_4_ = auVar82._20_4_ * -2.0;
            auVar18._24_4_ = auVar82._24_4_ * -2.0;
            auVar18._28_4_ = 0xc0000000;
            auVar77 = vminps_avx(auVar147,auVar18);
            auVar106._8_4_ = 0xc2b0c0a5;
            auVar106._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar106._12_4_ = 0xc2b0c0a5;
            auVar106._16_4_ = 0xc2b0c0a5;
            auVar106._20_4_ = 0xc2b0c0a5;
            auVar106._24_4_ = 0xc2b0c0a5;
            auVar106._28_4_ = 0xc2b0c0a5;
            auVar91 = vmaxps_avx(auVar77,auVar106);
            auVar107._0_4_ = auVar91._0_4_ * 1.442695 + 0.5;
            auVar107._4_4_ = auVar91._4_4_ * 1.442695 + 0.5;
            auVar107._8_4_ = auVar91._8_4_ * 1.442695 + 0.5;
            auVar107._12_4_ = auVar91._12_4_ * 1.442695 + 0.5;
            auVar107._16_4_ = auVar91._16_4_ * 1.442695 + 0.5;
            auVar107._20_4_ = auVar91._20_4_ * 1.442695 + 0.5;
            auVar107._24_4_ = auVar91._24_4_ * 1.442695 + 0.5;
            auVar107._28_4_ = 0xc2afc0a5;
            auVar101 = vroundps_avx(auVar107,1);
            auVar77 = vcmpps_avx(auVar107,auVar101,1);
            auVar77 = vandps_avx(auVar77,auVar143);
            auVar77 = vsubps_avx(auVar101,auVar77);
            auVar19._4_4_ = auVar77._4_4_ * 0.6931472;
            auVar19._0_4_ = auVar77._0_4_ * 0.6931472;
            auVar19._8_4_ = auVar77._8_4_ * 0.6931472;
            auVar19._12_4_ = auVar77._12_4_ * 0.6931472;
            auVar19._16_4_ = auVar77._16_4_ * 0.6931472;
            auVar19._20_4_ = auVar77._20_4_ * 0.6931472;
            auVar19._24_4_ = auVar77._24_4_ * 0.6931472;
            auVar19._28_4_ = auVar101._28_4_;
            auVar91 = vsubps_avx(auVar91,auVar19);
            fVar131 = auVar91._0_4_;
            fVar136 = auVar91._4_4_;
            fVar137 = auVar91._8_4_;
            fVar130 = auVar91._12_4_;
            fVar76 = auVar91._16_4_;
            fVar84 = auVar91._20_4_;
            fVar85 = auVar91._24_4_;
            in_ZMM6 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar119._0_4_ =
                 (fVar121 + 1.0 +
                 fVar121 * fVar121 *
                 (((((fVar121 * 0.00019875691 + 0.0013981999) * fVar121 + 0.008333452) * fVar121 +
                   0.041665796) * fVar121 + 0.16666666) * fVar121 + 0.5)) * auVar99._0_4_ + 1.0;
            auVar119._4_4_ =
                 (fVar127 + 1.0 +
                 fVar127 * fVar127 *
                 (((((fVar127 * 0.00019875691 + 0.0013981999) * fVar127 + 0.008333452) * fVar127 +
                   0.041665796) * fVar127 + 0.16666666) * fVar127 + 0.5)) * auVar99._4_4_ + 1.0;
            auVar119._8_4_ =
                 (fVar128 + 1.0 +
                 fVar128 * fVar128 *
                 (((((fVar128 * 0.00019875691 + 0.0013981999) * fVar128 + 0.008333452) * fVar128 +
                   0.041665796) * fVar128 + 0.16666666) * fVar128 + 0.5)) * auVar99._8_4_ + 1.0;
            auVar119._12_4_ =
                 (fVar129 + 1.0 +
                 fVar129 * fVar129 *
                 (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
                   0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar99._12_4_ + 1.0;
            auVar119._16_4_ =
                 (fVar148 + 1.0 +
                 fVar148 * fVar148 *
                 (((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) * fVar148 +
                   0.041665796) * fVar148 + 0.16666666) * fVar148 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar119._20_4_ =
                 (fVar8 + 1.0 +
                 fVar8 * fVar8 *
                 (((((fVar8 * 0.00019875691 + 0.0013981999) * fVar8 + 0.008333452) * fVar8 +
                   0.041665796) * fVar8 + 0.16666666) * fVar8 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar119._24_4_ =
                 (fVar9 + 1.0 +
                 fVar9 * fVar9 *
                 (((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                   0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar119._28_4_ = auVar78._28_4_ + 1.0 + auVar123._28_4_ + 1.0;
            auVar100._0_4_ = (int)auVar77._0_4_;
            auVar100._4_4_ = (int)auVar77._4_4_;
            auVar100._8_4_ = (int)auVar77._8_4_;
            auVar100._12_4_ = (int)auVar77._12_4_;
            auVar108._16_4_ = (int)auVar77._16_4_;
            auVar108._0_16_ = auVar100;
            auVar108._20_4_ = (int)auVar77._20_4_;
            auVar108._24_4_ = (int)auVar77._24_4_;
            auVar108._28_4_ = (int)auVar77._28_4_;
            auVar99 = vpslld_avx(auVar100,0x17);
            auVar90 = vpslld_avx(auVar108._16_16_,0x17);
            auVar90 = vpaddd_avx(auVar146,auVar90);
            auVar99 = vpaddd_avx(auVar146,auVar99);
            auVar96._0_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar99._0_4_ + 1.0;
            auVar96._4_4_ =
                 (fVar136 + 1.0 +
                 fVar136 * fVar136 *
                 (((((fVar136 * 0.00019875691 + 0.0013981999) * fVar136 + 0.008333452) * fVar136 +
                   0.041665796) * fVar136 + 0.16666666) * fVar136 + 0.5)) * auVar99._4_4_ + 1.0;
            auVar96._8_4_ =
                 (fVar137 + 1.0 +
                 fVar137 * fVar137 *
                 (((((fVar137 * 0.00019875691 + 0.0013981999) * fVar137 + 0.008333452) * fVar137 +
                   0.041665796) * fVar137 + 0.16666666) * fVar137 + 0.5)) * auVar99._8_4_ + 1.0;
            auVar96._12_4_ =
                 (fVar130 + 1.0 +
                 fVar130 * fVar130 *
                 (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
                   0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar99._12_4_ + 1.0;
            auVar96._16_4_ =
                 (fVar76 + 1.0 +
                 fVar76 * fVar76 *
                 (((((fVar76 * 0.00019875691 + 0.0013981999) * fVar76 + 0.008333452) * fVar76 +
                   0.041665796) * fVar76 + 0.16666666) * fVar76 + 0.5)) * auVar90._0_4_ + 1.0;
            auVar96._20_4_ =
                 (fVar84 + 1.0 +
                 fVar84 * fVar84 *
                 (((((fVar84 * 0.00019875691 + 0.0013981999) * fVar84 + 0.008333452) * fVar84 +
                   0.041665796) * fVar84 + 0.16666666) * fVar84 + 0.5)) * auVar90._4_4_ + 1.0;
            auVar96._24_4_ =
                 (fVar85 + 1.0 +
                 fVar85 * fVar85 *
                 (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 + 0.008333452) * fVar85 +
                   0.041665796) * fVar85 + 0.16666666) * fVar85 + 0.5)) * auVar90._8_4_ + 1.0;
            auVar96._28_4_ = auVar91._28_4_ + 1.0 + auVar101._28_4_ + 1.0;
            auVar77 = vrcpps_avx(auVar96);
            fVar121 = auVar77._0_4_;
            fVar131 = auVar77._4_4_;
            fVar127 = auVar77._8_4_;
            fVar136 = auVar77._12_4_;
            fVar128 = auVar77._16_4_;
            fVar137 = auVar77._20_4_;
            fVar129 = auVar77._24_4_;
            auVar20._4_4_ = auVar96._4_4_ * (fVar131 + fVar131);
            auVar20._0_4_ = auVar96._0_4_ * (fVar121 + fVar121);
            auVar20._8_4_ = auVar96._8_4_ * (fVar127 + fVar127);
            auVar20._12_4_ = auVar96._12_4_ * (fVar136 + fVar136);
            auVar20._16_4_ = auVar96._16_4_ * (fVar128 + fVar128);
            auVar20._20_4_ = auVar96._20_4_ * (fVar137 + fVar137);
            auVar20._24_4_ = auVar96._24_4_ * (fVar129 + fVar129);
            auVar20._28_4_ = auVar96._28_4_;
            auVar134._8_4_ = 0x40000000;
            auVar134._0_8_ = 0x4000000040000000;
            auVar134._12_4_ = 0x40000000;
            auVar134._16_4_ = 0x40000000;
            auVar134._20_4_ = 0x40000000;
            auVar134._24_4_ = 0x40000000;
            auVar134._28_4_ = 0x40000000;
            auVar101 = vsubps_avx(auVar134,auVar20);
            auVar91 = vrcpps_avx(auVar119);
            in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                         CONCAT424(0xbf800000,
                                                   CONCAT420(0xbf800000,
                                                             CONCAT416(0xbf800000,
                                                                       CONCAT412(0xbf800000,
                                                                                 CONCAT48(0xbf800000
                                                                                          ,
                                                  0xbf800000bf800000)))))));
            fVar130 = auVar77._28_4_ + auVar77._28_4_ + -1.0;
            auVar97._0_4_ = fVar121 + fVar121 + -1.0 + fVar121 * auVar101._0_4_;
            auVar97._4_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar101._4_4_;
            auVar97._8_4_ = fVar127 + fVar127 + -1.0 + fVar127 * auVar101._8_4_;
            auVar97._12_4_ = fVar136 + fVar136 + -1.0 + fVar136 * auVar101._12_4_;
            auVar97._16_4_ = fVar128 + fVar128 + -1.0 + fVar128 * auVar101._16_4_;
            auVar97._20_4_ = fVar137 + fVar137 + -1.0 + fVar137 * auVar101._20_4_;
            auVar97._24_4_ = fVar129 + fVar129 + -1.0 + fVar129 * auVar101._24_4_;
            auVar97._28_4_ = fVar130 + auVar101._28_4_;
            fVar121 = auVar97._0_4_ * auVar91._0_4_;
            fVar131 = auVar97._4_4_ * auVar91._4_4_;
            fVar127 = auVar97._8_4_ * auVar91._8_4_;
            fVar136 = auVar97._12_4_ * auVar91._12_4_;
            fVar128 = auVar97._16_4_ * auVar91._16_4_;
            fVar137 = auVar97._20_4_ * auVar91._20_4_;
            fVar129 = auVar97._24_4_ * auVar91._24_4_;
            auVar21._4_4_ = auVar119._4_4_ * fVar131;
            auVar21._0_4_ = auVar119._0_4_ * fVar121;
            auVar21._8_4_ = auVar119._8_4_ * fVar127;
            auVar21._12_4_ = auVar119._12_4_ * fVar136;
            auVar21._16_4_ = auVar119._16_4_ * fVar128;
            auVar21._20_4_ = auVar119._20_4_ * fVar137;
            auVar21._24_4_ = auVar119._24_4_ * fVar129;
            auVar21._28_4_ = auVar119._28_4_;
            in_ZMM3 = ZEXT3264(auVar21);
            auVar77 = vsubps_avx(auVar97,auVar21);
            fVar121 = fVar121 + auVar91._0_4_ * auVar77._0_4_;
            fVar131 = fVar131 + auVar91._4_4_ * auVar77._4_4_;
            fVar127 = fVar127 + auVar91._8_4_ * auVar77._8_4_;
            fVar136 = fVar136 + auVar91._12_4_ * auVar77._12_4_;
            fVar128 = fVar128 + auVar91._16_4_ * auVar77._16_4_;
            fVar137 = fVar137 + auVar91._20_4_ * auVar77._20_4_;
            fVar129 = fVar129 + auVar91._24_4_ * auVar77._24_4_;
            fVar130 = fVar130 + auVar77._28_4_;
            *(undefined1 (*) [32])((long)pvVar68 + lVar29) = auVar82;
            pfVar2 = (float *)((long)pvVar71 + lVar29);
            *pfVar2 = fVar121;
            pfVar2[1] = fVar131;
            pfVar2[2] = fVar127;
            pfVar2[3] = fVar136;
            pfVar2[4] = fVar128;
            pfVar2[5] = fVar137;
            pfVar2[6] = fVar129;
            pfVar2[7] = fVar130;
            pfVar2 = (float *)((long)pvVar44 + lVar29);
            *pfVar2 = fVar121;
            pfVar2[1] = fVar131;
            pfVar2[2] = fVar127;
            pfVar2[3] = fVar136;
            pfVar2[4] = fVar128;
            pfVar2[5] = fVar137;
            pfVar2[6] = fVar129;
            pfVar2[7] = fVar130;
            iVar24 = iVar24 + -1;
            lVar26 = lVar29 + 0x20;
          } while (1 < iVar24);
          pvVar55 = (void *)((long)pvVar55 + lVar26);
          pvVar61 = (void *)((long)pvVar61 + lVar26);
          ppp_Var41 = (_func_int ***)((long)(ppp_Var41 + 4) + lVar29);
          pAVar45 = (Allocator *)
                    ((long)&((Allocator *)((long)local_78.data + 0x20))->_vptr_Allocator + lVar29);
          pvVar71 = (void *)((long)pvVar71 + lVar26);
          pvVar68 = (void *)((long)pvVar68 + lVar26);
          pvVar44 = (void *)((long)pvVar44 + lVar26);
        }
        if ((_w & 7) != 0) {
          lVar26 = 0;
          iVar24 = iVar35;
          do {
            fVar121 = *(float *)((long)pvVar55 + lVar26);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            fVar131 = expf(-*(float *)((long)&pAVar45->_vptr_Allocator + lVar26));
            fVar127 = expf(-*(float *)((long)ppp_Var41 + lVar26));
            fVar136 = expf(-*(float *)((long)pvVar61 + lVar26));
            fVar121 = tanhf(fVar121);
            fVar121 = *(float *)((long)pvVar68 + lVar26) / (fVar127 + 1.0) +
                      fVar121 / (fVar131 + 1.0);
            fVar131 = tanhf(fVar121);
            fVar131 = fVar131 / (fVar136 + 1.0);
            *(float *)((long)pvVar68 + lVar26) = fVar121;
            *(float *)((long)pvVar71 + lVar26) = fVar131;
            *(float *)((long)pvVar44 + lVar26) = fVar131;
            iVar24 = iVar24 + -1;
            lVar26 = lVar26 + 4;
          } while (1 < iVar24);
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar6);
    }
    iVar34 = 0;
  }
  piVar22 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar22 != (int *)0x0) {
    LOCK();
    *piVar22 = *piVar22 + -1;
    UNLOCK();
    if (*piVar22 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_78.data != (Allocator *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar34;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanh(cell2);
            cell_state[q] = cell2;
            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}